

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_pushstring(HSQUIRRELVM v,SQChar *s,SQInteger len)

{
  SQString *x;
  long in_RSI;
  SQObjectPtr *in_RDI;
  SQInteger in_stack_ffffffffffffffc0;
  SQVM *this;
  SQChar *in_stack_ffffffffffffffc8;
  SQSharedState *in_stack_ffffffffffffffd0;
  
  if (in_RSI == 0) {
    SQVM::PushNull((SQVM *)0x114aec);
  }
  else {
    x = SQString::Create(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
    this = (SQVM *)&stack0xffffffffffffffd8;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,x);
    SQVM::Push(this,in_RDI);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  return;
}

Assistant:

void sq_pushstring(HSQUIRRELVM v,const SQChar *s,SQInteger len)
{
    if(s)
        v->Push(SQObjectPtr(SQString::Create(_ss(v), s, len)));
    else v->PushNull();
}